

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReduceMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reducemin(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x4f1) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x4f1;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    ReduceMinLayerParams::ReduceMinLayerParams(this_00.reducemin_);
    (this->layer_).reducemin_ = (ReduceMinLayerParams *)this_00;
  }
  return (ReduceMinLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceMinLayerParams* NeuralNetworkLayer::mutable_reducemin() {
  if (!has_reducemin()) {
    clear_layer();
    set_has_reducemin();
    layer_.reducemin_ = new ::CoreML::Specification::ReduceMinLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reduceMin)
  return layer_.reducemin_;
}